

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O0

void __thiscall
adios2::burstbuffer::FileDrainer::AddOperation(FileDrainer *this,FileDrainOperation *operation)

{
  queue<adios2::burstbuffer::FileDrainOperation,_std::deque<adios2::burstbuffer::FileDrainOperation,_std::allocator<adios2::burstbuffer::FileDrainOperation>_>_>
  *in_RDI;
  lock_guard<std::mutex> lockGuard;
  value_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffc8);
  std::
  queue<adios2::burstbuffer::FileDrainOperation,_std::deque<adios2::burstbuffer::FileDrainOperation,_std::allocator<adios2::burstbuffer::FileDrainOperation>_>_>
  ::push(in_RDI,in_stack_ffffffffffffffc8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xacf295);
  return;
}

Assistant:

void FileDrainer::AddOperation(FileDrainOperation &operation)
{
    std::lock_guard<std::mutex> lockGuard(operationsMutex);
    operations.push(operation);
}